

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  char *pcVar1;
  bool bVar2;
  Variant *pVVar3;
  size_t sVar4;
  ID IVar5;
  uint32_t uVar6;
  SPIRType *pSVar7;
  SPIRConstant *pSVar8;
  long lVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  uint uVar11;
  SmallVector<unsigned_int,_8UL> elements;
  undefined8 uStack_158;
  bool local_149;
  undefined4 local_148;
  uint32_t local_144;
  ulong local_140;
  ID local_138;
  uint local_134;
  AlignedBuffer<unsigned_int,_8UL> *local_130;
  SmallVector<unsigned_int,_8UL> local_128 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  uVar10 = (ulong)id;
  local_144 = type;
  if ((this->ids).super_VectorView<spirv_cross::Variant>.buffer_size <= uVar10) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x40b,"void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)")
    ;
  }
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + type);
  if (pSVar7->pointer == true) {
    if (add_to_typed_id_set) {
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar10;
    pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                       ((ObjectPool<spirv_cross::SPIRConstant> *)
                        pVVar3->group->pools[3]._M_t.
                        super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,
                        &local_144);
    Variant::set(pVVar3,&pSVar8->super_IVariant,TypeConstant);
    (pSVar8->super_IVariant).self.id = id;
    memset(local_128,0,0xf8);
    lVar9 = 0x30;
    do {
      *(undefined8 *)((long)&local_138.id + lVar9) = 0;
      *(undefined8 *)((long)&local_130 + lVar9) = 0;
      pcVar1 = local_128[0].stack_storage.aligned_char + lVar9 + -0x18;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined8 *)((long)&uStack_158 + lVar9) = 0;
      *(undefined8 *)(&stack0xfffffffffffffeb0 + lVar9) = 0;
      *(undefined8 *)((long)&local_148 + lVar9) = 0;
      *(undefined8 *)((long)&local_140 + lVar9) = 0;
      lVar9 = lVar9 + 0x38;
    } while (lVar9 != 0x110);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 1;
    memcpy(&pSVar8->m,local_128,0xf4);
    (pSVar8->m).columns = pSVar7->columns;
    uVar6 = pSVar7->vecsize;
    lVar9 = -0xe0;
    do {
      *(uint32_t *)((pSVar8->subconstants).stack_storage.aligned_char + lVar9 + -8) = uVar6;
      lVar9 = lVar9 + 0x38;
    } while (lVar9 != 0);
  }
  else {
    local_148 = (undefined4)CONCAT71(in_register_00000009,add_to_typed_id_set);
    local_140 = uVar10;
    if ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar4 = (pSVar7->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar4 == 0) {
        if (add_to_typed_id_set) {
          add_typed_id(this,TypeConstant,(ID)id);
        }
        pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar10;
        pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                           ((ObjectPool<spirv_cross::SPIRConstant> *)
                            pVVar3->group->pools[3]._M_t.
                            super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                            .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>.
                            _M_head_impl,&local_144);
        Variant::set(pVVar3,&pSVar8->super_IVariant,TypeConstant);
        (pSVar8->super_IVariant).self.id = id;
        memset(local_128,0,0xf8);
        lVar9 = 0x30;
        do {
          *(undefined8 *)((long)&local_138.id + lVar9) = 0;
          *(undefined8 *)((long)&local_130 + lVar9) = 0;
          pcVar1 = local_128[0].stack_storage.aligned_char + lVar9 + -0x18;
          pcVar1[0] = '\x01';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          *(undefined8 *)((long)&uStack_158 + lVar9) = 0;
          *(undefined8 *)(&stack0xfffffffffffffeb0 + lVar9) = 0;
          *(undefined8 *)((long)&local_148 + lVar9) = 0;
          *(undefined8 *)((long)&local_140 + lVar9) = 0;
          lVar9 = lVar9 + 0x38;
        } while (lVar9 != 0x110);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 1;
        memcpy(&pSVar8->m,local_128,0xf4);
        (pSVar8->m).columns = pSVar7->columns;
        uVar6 = pSVar7->vecsize;
        lVar9 = -0xe0;
        do {
          *(uint32_t *)((pSVar8->subconstants).stack_storage.aligned_char + lVar9 + -8) = uVar6;
          lVar9 = lVar9 + 0x38;
        } while (lVar9 != 0);
        return;
      }
      local_138.id = id;
      uVar6 = increase_bound_by(this,(uint32_t)sVar4);
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      SmallVector<unsigned_int,_8UL>::resize
                (local_128,
                 (pSVar7->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      if ((pSVar7->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size != 0) {
        uVar11 = 1;
        uVar10 = 0;
        bVar2 = (bool)(char)local_148;
        do {
          make_constant_null(this,uVar6,
                             (pSVar7->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar10].id,bVar2);
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar10 * 4) =
               uVar6;
          uVar10 = (ulong)uVar11;
          uVar6 = uVar6 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar10 < (pSVar7->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                );
      }
      IVar5.id = local_138.id;
      if ((char)local_148 != '\0') {
        add_typed_id(this,TypeConstant,local_138);
      }
      uVar10 = local_140;
      pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_149 = false;
      pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::
               allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((ObjectPool<spirv_cross::SPIRConstant> *)
                          (pVVar3[local_140].group)->pools[3]._M_t.
                          super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ,&local_144,(uint **)&local_130,&local_134,&local_149);
      Variant::set(pVVar3 + uVar10,&pSVar8->super_IVariant,TypeConstant);
      (pSVar8->super_IVariant).self.id = IVar5.id;
    }
    else {
      if ((pSVar7->parent_type).id == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x419,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar11 = 1;
      uVar6 = increase_bound_by(this,1);
      make_constant_null(this,uVar6,(pSVar7->parent_type).id,add_to_typed_id_set);
      bVar2 = (pSVar7->array_size_literal).super_VectorView<bool>.ptr
              [(pSVar7->array_size_literal).super_VectorView<bool>.buffer_size - 1];
      if (bVar2 == true) {
        uVar11 = (pSVar7->array).super_VectorView<unsigned_int>.ptr
                 [(pSVar7->array).super_VectorView<unsigned_int>.buffer_size - 1];
      }
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      SmallVector<unsigned_int,_8UL>::resize(local_128,(ulong)uVar11);
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar10 * 4) =
               uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      if ((char)local_148 != '\0') {
        add_typed_id(this,TypeConstant,(ID)id);
      }
      uVar10 = local_140;
      pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_149 = false;
      pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::
               allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((ObjectPool<spirv_cross::SPIRConstant> *)
                          (pVVar3[local_140].group)->pools[3]._M_t.
                          super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ,&local_144,(uint **)&local_130,&local_134,&local_149);
      Variant::set(pVVar3 + uVar10,&pSVar8->super_IVariant,TypeConstant);
      (pSVar8->super_IVariant).self.id = id;
      pSVar8->is_null_array_specialized_length = (bool)(bVar2 ^ 1);
    }
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr !=
        &local_128[0].stack_storage) {
      free(local_128[0].super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	assert(id < ids.size());

	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;

		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto& constant = variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false);
		constant.self = id;
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}